

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procs.hpp
# Opt level: O0

bool __thiscall henson::ProcMap::is_leader(ProcMap *this,int rank)

{
  bool bVar1;
  pointer ppVar2;
  int in_ESI;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>
  *in_RDI;
  const_iterator it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  int local_14;
  
  local_14 = in_ESI;
  level((ProcMap *)0x19c0cc);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>_>
       ::begin(in_stack_ffffffffffffffc8);
  while( true ) {
    level((ProcMap *)0x19c0e7);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
      return false;
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>
                           *)0x19c117);
    if ((ppVar2->second).leader == local_14) break;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>
    ::operator++(in_RDI);
  }
  return true;
}

Assistant:

bool        is_leader(int rank) const                               { for (GroupMap::const_iterator it = level().groups.begin(); it != level().groups.end(); ++it) if (it->second.leader == rank) return true; return false; }